

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint _c;
  long lVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  pointer pMVar8;
  int *piVar9;
  bool bVar10;
  pointer pRVar11;
  pointer pRVar12;
  undefined8 *puVar13;
  undefined1 (*pauVar14) [16];
  uint _h;
  void *pvVar15;
  ulong uVar16;
  Rect *pRVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  void *pvVar22;
  void *pvVar23;
  float *pfVar24;
  int iVar25;
  void *pvVar26;
  float *__args;
  int _c_00;
  ulong uVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> scores;
  Rect r;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_238;
  void *local_218;
  iterator iStack_210;
  unsigned_long *local_208;
  vector<float,_std::allocator<float>_> local_1f8;
  pointer local_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  pointer local_1c8;
  ulong local_1c0;
  undefined1 (*local_1b8) [16];
  unsigned_long local_1b0;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_180;
  ulong local_178;
  void *local_170;
  void *local_168;
  undefined1 (*local_160) [16];
  void *local_158;
  void *local_150;
  ulong local_148;
  void *local_140;
  ulong local_138;
  ulong local_130;
  Mat local_128;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1e0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_138 = (ulong)local_1e0->w;
  local_130 = (ulong)(uint)local_1e0->h;
  _c = (this->anchors).h;
  local_128.cstep = 0;
  _h = local_1e0->h * local_1e0->w;
  local_128.data = (undefined1 (*) [16])0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  local_180 = top_blobs;
  Mat::create(&local_128,4,_h,_c,4,(Allocator *)0x0);
  local_178 = (ulong)_h;
  local_148 = (ulong)_c;
  if ((int)_c < 1) {
    puVar13 = (undefined8 *)local_1e0[2].data;
  }
  else {
    local_a8 = local_138 & 0xffffffff;
    local_150 = local_1e0[1].data;
    lVar18 = local_1e0[1].cstep * local_1e0[1].elemsize;
    local_160 = (undefined1 (*) [16])local_128.data;
    local_140 = (this->anchors).data;
    local_1a4 = (float)this->feat_stride;
    local_e0 = (long)(this->anchors).w * (this->anchors).elemsize;
    local_d0 = local_128.cstep * CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
    lVar20 = (long)local_128.w * CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
    local_b8 = lVar20 * local_a8;
    local_168 = (void *)(lVar18 * 3 + (long)local_150);
    local_d8 = lVar18 * 4;
    local_c0 = local_138 * 4;
    local_170 = (void *)((long)local_150 + lVar18 * 2);
    local_158 = (void *)(lVar18 + (long)local_150);
    local_1c0 = 0;
    do {
      if (0 < (int)local_130) {
        local_c8 = local_e0 * local_1c0;
        fVar28 = (float)((ulong)*(undefined8 *)((long)local_140 + local_c8) >> 0x20);
        uVar3 = *(undefined8 *)((long)local_140 + local_c8 + 8);
        fVar32 = (float)uVar3 - (float)*(undefined8 *)((long)local_140 + local_c8);
        fVar34 = (float)((ulong)uVar3 >> 0x20) - fVar28;
        fStack_80 = fVar32 * 0.5;
        fStack_7c = fVar34 * 0.5;
        local_1a0 = (float)this->feat_stride;
        local_1b8 = local_160;
        uVar27 = 0;
        local_78 = CONCAT44(fVar34,fVar32);
        uStack_70 = 0;
        pvVar15 = local_150;
        pvVar22 = local_168;
        pvVar23 = local_158;
        pvVar26 = local_170;
        fVar29 = fVar28;
        fVar33 = fVar28;
        fVar31 = fVar28;
        local_98 = fVar34;
        fStack_94 = fVar34;
        fStack_90 = fVar34;
        fStack_8c = fVar34;
        do {
          local_b0 = uVar27;
          if (0 < (int)local_138) {
            fVar35 = *(float *)((long)local_140 + local_c8);
            uStack_194 = 0;
            uStack_190 = 0;
            uStack_18c = 0;
            uVar27 = 0;
            pauVar14 = local_1b8;
            local_a0 = pvVar22;
            local_68 = fVar28;
            fStack_64 = fVar29;
            fStack_60 = fVar33;
            fStack_5c = fVar31;
            do {
              local_19c = *(float *)((long)local_a0 + uVar27 * 4);
              local_48._4_4_ = 0;
              local_48._0_4_ = (*(float *)((long)pvVar23 + uVar27 * 4) + 0.5) * fVar34;
              local_48._8_4_ = (*(float *)((long)pvVar15 + uVar27 * 4) + 0.5) * fVar32;
              local_48._12_4_ = 0;
              local_198 = fVar35;
              local_58 = expf(*(float *)((long)pvVar26 + uVar27 * 4));
              fVar28 = expf(local_19c);
              *(float *)*pauVar14 = ((float)local_48._8_4_ + local_198) - local_58 * fStack_80;
              *(float *)(*pauVar14 + 4) = ((float)local_48._0_4_ + local_68) - fVar28 * fStack_7c;
              *(float *)(*pauVar14 + 8) = (float)local_48._8_4_ + local_198 + local_58 * fStack_80;
              *(float *)(*pauVar14 + 0xc) = (float)local_48._0_4_ + local_68 + fVar28 * fStack_7c;
              fVar35 = local_198 + local_1a0;
              uVar27 = uVar27 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar20);
              pvVar22 = local_a0;
              fVar28 = local_68;
              fVar29 = fStack_64;
              fVar33 = fStack_60;
              fVar31 = fStack_5c;
              fVar32 = (float)local_78;
              fVar34 = local_98;
            } while (local_a8 != uVar27);
          }
          fVar28 = fVar28 + local_1a4;
          uVar27 = local_b0 + 1;
          local_1b8 = (undefined1 (*) [16])(*local_1b8 + local_b8);
          pvVar22 = (void *)((long)pvVar22 + local_c0);
          pvVar26 = (void *)((long)pvVar26 + local_c0);
          pvVar23 = (void *)((long)pvVar23 + local_c0);
          pvVar15 = (void *)((long)pvVar15 + local_c0);
        } while (uVar27 != local_130);
      }
      local_1c0 = local_1c0 + 1;
      local_160 = (undefined1 (*) [16])(*local_160 + local_d0);
      local_168 = (void *)((long)local_168 + local_d8);
      local_170 = (void *)((long)local_170 + local_d8);
      local_158 = (void *)((long)local_158 + local_d8);
      local_150 = (void *)((long)local_150 + local_d8);
    } while (local_1c0 != local_148);
    puVar13 = (undefined8 *)local_1e0[2].data;
    if (0 < (int)local_148) {
      fVar28 = (float)*puVar13;
      fVar29 = (float)((ulong)*puVar13 >> 0x20);
      uVar27 = 0;
      pauVar14 = (undefined1 (*) [16])local_128.data;
      do {
        uVar19 = local_178;
        pauVar21 = pauVar14;
        if (0 < (int)_h) {
          do {
            auVar30._4_4_ = fVar28 + -1.0;
            auVar30._0_4_ = fVar29 + -1.0;
            auVar30._8_4_ = fVar29 + -1.0;
            auVar30._12_4_ = fVar28 + -1.0;
            auVar30 = minps(*pauVar21,auVar30);
            auVar30 = maxps(auVar30,ZEXT816(0));
            *pauVar21 = auVar30;
            pauVar21 = (undefined1 (*) [16])
                       (*pauVar21 +
                       (long)local_128.w *
                       CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize));
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        uVar27 = uVar27 + 1;
        pauVar14 = (undefined1 (*) [16])
                   (*pauVar14 +
                   CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) *
                   local_128.cstep);
      } while (uVar27 != local_148);
    }
  }
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_148) {
    local_198 = (float)this->min_size * *(float *)(puVar13 + 1);
    uVar19 = 0;
    uVar27 = local_148;
    do {
      if (0 < (int)_h) {
        lVar18 = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        lVar20 = (long)local_128.w;
        __args = (float *)(local_1e0->elemsize * local_1e0->cstep * uVar27 + (long)local_1e0->data);
        pfVar24 = (float *)((undefined1 *)local_128.data + local_128.cstep * lVar18 * uVar19 + 0xc);
        uVar16 = local_178;
        do {
          fVar28 = pfVar24[-3];
          if ((local_198 <= (pfVar24[-1] + 1.0) - fVar28) &&
             (local_198 <= (*pfVar24 + 1.0) - pfVar24[-2])) {
            local_1d8._4_4_ = pfVar24[-2];
            fStack_1d0 = pfVar24[-1];
            fStack_1cc = *pfVar24;
            local_1d8._0_4_ = fVar28;
            if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_238,
                         (iterator)
                         local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_1d8);
            }
            else {
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = fVar28;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_1d8._4_4_;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = fStack_1d0;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_1cc;
              local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1f8,
                         (iterator)
                         local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,__args);
            }
            else {
              *local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *__args;
              local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          __args = __args + 1;
          pfVar24 = (float *)((long)pfVar24 + lVar20 * lVar18);
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      uVar19 = uVar19 + 1;
      uVar27 = uVar27 + 1;
    } while (uVar19 != local_148);
    if ((local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_238,&local_1f8,0,
                 (int)((ulong)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar25 = this->pre_nms_topN;
  if ((0 < (long)iVar25) &&
     (iVar25 < (int)((ulong)((long)local_238.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_238.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_238,(long)iVar25);
    std::vector<float,_std::allocator<float>_>::resize(&local_1f8,(long)this->pre_nms_topN);
  }
  pRVar12 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar11 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_218 = (void *)0x0;
  iStack_210._M_current = (unsigned_long *)0x0;
  local_208 = (unsigned_long *)0x0;
  local_198 = this->nms_thresh;
  uVar27 = (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1d8,uVar27,(allocator_type *)&local_1b0)
  ;
  if (pRVar12 != pRVar11) {
    pfVar24 = &(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar18 = 0;
    do {
      uVar2 = ((Rect *)(pfVar24 + -2))->x1;
      uVar4 = ((Rect *)(pfVar24 + -2))->y1;
      *(float *)(CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + lVar18 * 4) =
           ((float)((ulong)*(undefined8 *)pfVar24 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar24 - (float)uVar2);
      lVar18 = lVar18 + 1;
      pfVar24 = pfVar24 + 4;
    } while (uVar27 + (uVar27 == 0) != lVar18);
    local_1b0 = 0;
    do {
      if ((long)iStack_210._M_current - (long)local_218 == 0) {
LAB_0030f639:
        if (iStack_210._M_current == local_208) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_218,iStack_210,
                     &local_1b0);
        }
        else {
          *iStack_210._M_current = local_1b0;
          iStack_210._M_current = iStack_210._M_current + 1;
        }
      }
      else {
        lVar18 = (long)iStack_210._M_current - (long)local_218 >> 3;
        fVar28 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start[local_1b0].x1;
        bVar10 = true;
        lVar20 = 0;
        do {
          lVar5 = *(long *)((long)local_218 + lVar20 * 8);
          fVar29 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5].x2;
          fVar33 = 0.0;
          if (fVar28 <= fVar29) {
            pRVar17 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5;
            fVar31 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[local_1b0].x2;
            fVar32 = pRVar17->x1;
            if (fVar32 <= fVar31) {
              fVar34 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_1b0].y1;
              fVar35 = pRVar17->y2;
              if (fVar34 <= fVar35) {
                fVar1 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_1b0].y2;
                fVar36 = pRVar17->y1;
                if (fVar36 <= fVar1) {
                  if (fVar31 <= fVar29) {
                    fVar29 = fVar31;
                  }
                  if (fVar32 <= fVar28) {
                    fVar32 = fVar28;
                  }
                  if (fVar1 <= fVar35) {
                    fVar35 = fVar1;
                  }
                  if (fVar36 <= fVar34) {
                    fVar36 = fVar34;
                  }
                  fVar33 = (fVar35 - fVar36) * (fVar29 - fVar32);
                }
              }
            }
          }
          if (local_198 <
              fVar33 / ((*(float *)(CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + local_1b0 * 4) -
                        fVar33) + *(float *)(CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + lVar5 * 4))
             ) {
            bVar10 = false;
          }
          lVar20 = lVar20 + 1;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar20);
        if (bVar10) goto LAB_0030f639;
      }
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 < uVar27);
  }
  pvVar15 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  if (pvVar15 != (void *)0x0) {
    operator_delete(pvVar15,(long)local_1c8 - (long)pvVar15);
  }
  uVar27 = (ulong)((long)iStack_210._M_current - (long)local_218) >> 3;
  uVar19 = uVar27 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar27) {
    uVar19 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _c_00 = (int)uVar19;
  Mat::create(this_00,4,1,_c_00,4,(Allocator *)0x0);
  iVar25 = -100;
  if ((this_00->data != (void *)0x0) && (sVar6 = this_00->cstep, (long)this_00->c * sVar6 != 0)) {
    if (0 < _c_00) {
      sVar7 = this_00->elemsize;
      pfVar24 = (float *)((long)this_00->data + 0xc);
      uVar27 = 0;
      do {
        lVar18 = *(long *)((long)local_218 + uVar27 * 8);
        pfVar24[-3] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].x1;
        pfVar24[-2] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].y1;
        pfVar24[-1] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].x2;
        *pfVar24 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18].y2;
        uVar27 = uVar27 + 1;
        pfVar24 = (float *)((long)pfVar24 + sVar6 * sVar7);
      } while (uVar19 != uVar27);
    }
    pMVar8 = (local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar25 = 0;
    if (1 < (ulong)(((long)(local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                   -0x71c71c71c71c71c7)) {
      Mat::create(pMVar8 + 1,1,1,_c_00,4,(Allocator *)0x0);
      pfVar24 = (float *)pMVar8[1].data;
      iVar25 = -100;
      if (pfVar24 != (float *)0x0) {
        sVar6 = pMVar8[1].cstep;
        iVar25 = -100;
        if (((long)pMVar8[1].c * sVar6 != 0) && (iVar25 = 0, 0 < _c_00)) {
          sVar7 = pMVar8[1].elemsize;
          iVar25 = 0;
          uVar27 = 0;
          do {
            *pfVar24 = local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[*(long *)((long)local_218 + uVar27 * 8)];
            uVar27 = uVar27 + 1;
            pfVar24 = (float *)((long)pfVar24 + sVar6 * sVar7);
          } while (uVar19 != uVar27);
        }
      }
    }
  }
  if (local_218 != (void *)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  piVar9 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_128.data != (undefined1 (*) [16])0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * expf(dw);
                float pb_h = anchor_h * expf(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}